

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtrGroup.c
# Opt level: O1

MtrNode * Mtr_ReadGroups(FILE *fp,int nleaves)

{
  byte bVar1;
  uint size_00;
  uint low_00;
  int iVar2;
  MtrNode *root;
  size_t sVar3;
  byte *pbVar4;
  MtrNode *pMVar5;
  uint flags;
  int size;
  int low;
  char attrib [33];
  uint local_60;
  uint local_5c;
  byte local_58 [40];
  
  root = Mtr_InitTree();
  if (root == (MtrNode *)0x0) {
    root = (MtrNode *)0x0;
  }
  else {
    root->flags = 0;
    root->low = 0;
    root->size = nleaves;
  }
  if (root == (MtrNode *)0x0) {
    return (MtrNode *)0x0;
  }
LAB_0080e59e:
  iVar2 = feof((FILE *)fp);
  if (iVar2 != 0) {
    return root;
  }
  iVar2 = __isoc99_fscanf(fp,"%d %d %s",&local_5c,&local_60,local_58);
  low_00 = local_5c;
  size_00 = local_60;
  if (iVar2 == 3) {
    if ((((-1 < (int)local_5c) && (0 < (int)local_60)) && ((int)(local_5c + local_60) <= nleaves))
       && (sVar3 = strlen((char *)local_58), sVar3 < 0x21)) {
      flags = 0;
      pbVar4 = local_58;
      do {
        bVar1 = *pbVar4;
        if (bVar1 < 0x4e) {
          if (bVar1 != 0x44) {
            if (bVar1 != 0x46) goto LAB_0080e63c;
            flags = flags | 4;
          }
        }
        else if (bVar1 == 0x4e) {
          flags = flags | 8;
        }
        else if (bVar1 == 0x53) {
          flags = flags | 2;
        }
        else {
          if (bVar1 != 0x54) {
            return (MtrNode *)0x0;
          }
          flags = flags | 1;
        }
        pbVar4 = pbVar4 + 1;
      } while( true );
    }
  }
  else if (iVar2 == -1) {
    return root;
  }
  goto LAB_0080e65e;
LAB_0080e63c:
  if (bVar1 != 0) {
    return (MtrNode *)0x0;
  }
  pMVar5 = Mtr_MakeGroup(root,low_00,size_00,flags);
  if (pMVar5 == (MtrNode *)0x0) {
LAB_0080e65e:
    Mtr_FreeTree(root);
    return (MtrNode *)0x0;
  }
  goto LAB_0080e59e;
}

Assistant:

MtrNode *
Mtr_ReadGroups(
  FILE * fp /* file pointer */,
  int  nleaves /* number of leaves of the new tree */)
{
    int low;
    int size;
    int err;
    unsigned int flags;
    MtrNode *root;
    MtrNode *node;
    char attrib[8*sizeof(unsigned int)+1];
    char *c;

    root = Mtr_InitGroupTree(0,nleaves);
    if (root == NULL) return NULL;

    while (! feof(fp)) {
        /* Read a triple and check for consistency. */
        err = fscanf(fp, "%d %d %s", &low, &size, attrib);
        if (err == EOF) {
            break;
        } else if (err != 3) {
            Mtr_FreeTree(root);
            return(NULL);
        } else if (low < 0 || low+size > nleaves || size < 1) {
            Mtr_FreeTree(root);
            return(NULL);
        } else if (strlen(attrib) > 8 * sizeof(MtrHalfWord)) {
            /* Not enough bits in the flags word to store these many
            ** attributes. */
            Mtr_FreeTree(root);
            return(NULL);
        }

        /* Parse the flag string. Currently all flags are permitted,
        ** to make debugging easier. Normally, specifying NEWNODE
        ** wouldn't be allowed. */
        flags = MTR_DEFAULT;
        for (c=attrib; *c != 0; c++) {
            switch (*c) {
            case 'D':
                break;
            case 'F':
                flags |= MTR_FIXED;
                break;
            case 'N':
                flags |= MTR_NEWNODE;
                break;
            case 'S':
                flags |= MTR_SOFT;
                break;
            case 'T':
                flags |= MTR_TERMINAL;
                break;
            default:
                return NULL;
            }
        }
        node = Mtr_MakeGroup(root, (MtrHalfWord) low, (MtrHalfWord) size,
                             flags);
        if (node == NULL) {
            Mtr_FreeTree(root);
            return(NULL);
        }
    }

    return(root);

}